

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::App(App *this,string *description_,string *name,App *parent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar3;
  Option *pOVar4;
  App *pAVar5;
  undefined8 uVar6;
  _Rb_tree_header *p_Var7;
  bool bVar8;
  bool bVar9;
  undefined1 uVar10;
  MultiOptionPolicy MVar11;
  element_type *__p;
  element_type *__p_00;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->_vptr_App = (_func_int **)&PTR__App_0014bea8;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar6;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->description_).field_2;
  (this->description_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (description_->_M_dataplus)._M_p;
  paVar2 = &description_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&description_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->description_).field_2 + 8) = uVar6;
  }
  else {
    (this->description_)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->description_)._M_string_length = description_->_M_string_length;
  (description_->_M_dataplus)._M_p = (pointer)paVar2;
  description_->_M_string_length = 0;
  (description_->field_2)._M_local_buf[0] = '\0';
  this->allow_extras_ = false;
  this->allow_config_extras_ = false;
  this->prefix_command_ = false;
  *(undefined8 *)&(this->callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback_).super__Function_base._M_functor + 8) = 0;
  (this->callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback_)._M_invoker = (_Invoker_type)0x0;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_._M_dataplus._M_p =
       (pointer)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2;
  *(undefined4 *)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2 =
       0x6974704f;
  *(undefined4 *)
   ((long)&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2 + 3) =
       0x736e6f69;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_._M_string_length = 7;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2._M_local_buf[7] =
       '\0';
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = false;
  (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_ = true;
  *(undefined8 *)
   &(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.multi_option_policy_ = 0;
  *(undefined8 *)
   ((long)&(this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->footer_)._M_dataplus._M_p = (pointer)&(this->footer_).field_2;
  (this->footer_)._M_string_length = 0;
  (this->footer_).field_2._M_local_buf[0] = '\0';
  this->help_ptr_ = (Option *)0x0;
  this->help_all_ptr_ = (Option *)0x0;
  __p = (element_type *)operator_new(0x40);
  ((FormatterBase *)&__p->_vptr_FormatterBase)->_vptr_FormatterBase = (_func_int **)0x0;
  __p->column_width_ = 0;
  *(undefined8 *)&(__p->labels_)._M_t._M_impl = 0;
  *(undefined8 *)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       (_Base_ptr)0x0;
  (__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __p->column_width_ = 0x1e;
  p_Var7 = &(__p->labels_)._M_t._M_impl.super__Rb_tree_header;
  (__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var7;
  *(_Rb_tree_header **)((long)&(__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var7;
  (__p->labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ((FormatterBase *)&__p->_vptr_FormatterBase)->_vptr_FormatterBase =
       (_func_int **)&PTR__FormatterBase_0014bd50;
  (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p
  ;
  this_00 = &(this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::Formatter*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(Formatter *)__p);
  *(undefined8 *)&(this->failure_message_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->failure_message_).super__Function_base._M_functor + 8) = 0;
  (this->failure_message_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->failure_message_)._M_invoker = (_Invoker_type)0x0;
  *(code **)&(this->failure_message_).super__Function_base._M_functor =
       FailureMessage::simple_abi_cxx11_;
  (this->failure_message_)._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_CLI::App_*,_const_CLI::Error_&)>
       ::_M_invoke;
  (this->failure_message_).super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_CLI::App_*,_const_CLI::Error_&)>
       ::_M_manager;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->ignore_case_ = false;
  this->fallthrough_ = false;
  this->parent_ = parent;
  this->parsed_ = false;
  this->require_subcommand_min_ = 0;
  this->require_subcommand_max_ = 0;
  (this->group_)._M_dataplus._M_p = (pointer)&(this->group_).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->group_,"Subcommands","");
  (this->config_name_)._M_dataplus._M_p = (pointer)&(this->config_name_).field_2;
  (this->config_name_)._M_string_length = 0;
  (this->config_name_).field_2._M_local_buf[0] = '\0';
  this->config_required_ = false;
  this->config_ptr_ = (Option *)0x0;
  __p_00 = (element_type *)operator_new(0x20);
  ((Config *)&__p_00->_vptr_Config)->_vptr_Config = (_func_int **)0x0;
  (__p_00->items).super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->items).super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->items).super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((Config *)&__p_00->_vptr_Config)->_vptr_Config = (_func_int **)&PTR_to_config_0014be08;
  (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __p_00;
  this_01 = &(this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CLI::ConfigINI*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01,(ConfigINI *)__p_00);
  if (this->parent_ != (App *)0x0) {
    pOVar4 = this->parent_->help_ptr_;
    if (pOVar4 != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_50,pOVar4,false,true);
      pOVar4 = this->parent_->help_ptr_;
      pcVar3 = (pOVar4->description_)._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + (pOVar4->description_)._M_string_length);
      set_help_flag(this,&local_50,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    pOVar4 = this->parent_->help_all_ptr_;
    if (pOVar4 != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_70,pOVar4,false,true);
      pOVar4 = this->parent_->help_all_ptr_;
      pcVar3 = (pOVar4->description_)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + (pOVar4->description_)._M_string_length);
      set_help_all_flag(this,&local_70,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    pAVar5 = this->parent_;
    ::std::__cxx11::string::_M_assign((string *)&this->option_defaults_);
    bVar8 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_;
    bVar9 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_;
    uVar10 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.field_0x23;
    MVar11 = (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.multi_option_policy_;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_ =
         (pAVar5->option_defaults_).super_OptionBase<CLI::OptionDefaults>.required_;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = bVar8;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.configurable_ = bVar9;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.field_0x23 = uVar10;
    (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.multi_option_policy_ = MVar11;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
    ::operator=(&this->failure_message_,&this->parent_->failure_message_);
    pAVar5 = this->parent_;
    this->allow_extras_ = pAVar5->allow_extras_;
    this->allow_config_extras_ = pAVar5->allow_config_extras_;
    this->prefix_command_ = pAVar5->prefix_command_;
    this->ignore_case_ = pAVar5->ignore_case_;
    this->fallthrough_ = pAVar5->fallthrough_;
    ::std::__cxx11::string::_M_assign((string *)&this->group_);
    ::std::__cxx11::string::_M_assign((string *)&this->footer_);
    pAVar5 = this->parent_;
    (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pAVar5->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&(pAVar5->formatter_).
                        super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    pAVar5 = this->parent_;
    (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pAVar5->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,&(pAVar5->config_formatter_).
                        super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this->require_subcommand_max_ = this->parent_->require_subcommand_max_;
  }
  return;
}

Assistant:

App(std::string description_, std::string name, App *parent)
        : name_(std::move(name)), description_(std::move(description_)), parent_(parent) {
        // Inherit if not from a nullptr
        if(parent_ != nullptr) {
            if(parent_->help_ptr_ != nullptr)
                set_help_flag(parent_->help_ptr_->get_name(false, true), parent_->help_ptr_->get_description());
            if(parent_->help_all_ptr_ != nullptr)
                set_help_all_flag(parent_->help_all_ptr_->get_name(false, true),
                                  parent_->help_all_ptr_->get_description());

            /// OptionDefaults
            option_defaults_ = parent_->option_defaults_;

            // INHERITABLE
            failure_message_ = parent_->failure_message_;
            allow_extras_ = parent_->allow_extras_;
            allow_config_extras_ = parent_->allow_config_extras_;
            prefix_command_ = parent_->prefix_command_;
            ignore_case_ = parent_->ignore_case_;
            fallthrough_ = parent_->fallthrough_;
            group_ = parent_->group_;
            footer_ = parent_->footer_;
            formatter_ = parent_->formatter_;
            config_formatter_ = parent_->config_formatter_;
            require_subcommand_max_ = parent_->require_subcommand_max_;
        }
    }